

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

void SetPreviousTracker(Lexer *lexer)

{
  LexerTracker *pLVar1;
  LexerTracker *previous;
  Lexer *lexer_local;
  
  lexer->previousTrackerSpot = lexer->previousTrackerSpot + 1;
  if (lexer->totalTrackers <= lexer->previousTrackerSpot) {
    lexer->previousTrackerSpot = 0;
  }
  pLVar1 = lexer->previousTrackers + lexer->previousTrackerSpot;
  pLVar1->col = (lexer->tracker).col;
  pLVar1->currentTokenPosition = (lexer->tracker).currentTokenPosition;
  pLVar1->row = (lexer->tracker).row;
  pLVar1->tokenEnd = (lexer->tracker).tokenEnd;
  pLVar1->tokenStart = (lexer->tracker).tokenStart;
  return;
}

Assistant:

void SetPreviousTracker(Lexer* lexer){

	lexer->previousTrackerSpot++;
	if (lexer->previousTrackerSpot >= lexer->totalTrackers){
		lexer->previousTrackerSpot = 0;
	}

	LexerTracker* previous = &lexer->previousTrackers[lexer->previousTrackerSpot];

	previous->col = lexer->tracker.col;
	previous->currentTokenPosition = lexer->tracker.currentTokenPosition;
	previous->row = lexer->tracker.row;
	previous->tokenEnd = lexer->tracker.tokenEnd;
	previous->tokenStart = lexer->tracker.tokenStart;
}